

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool __thiscall
bssl::ParseTbsCertificate
          (bssl *this,Input tbs_tlv,ParseCertificateOptions *options,ParsedTbsCertificate *out,
          CertErrors *errors)

{
  Input input;
  bool bVar1;
  Input *pIVar2;
  ParseCertificateOptions *version_00;
  GeneralizedTime *not_before;
  size_t extraout_RDX;
  ParsedTbsCertificate *not_after;
  Input in;
  Input value;
  Input validity_tlv_00;
  Input input_00;
  Input in_00;
  Input in_01;
  _Storage<bssl::der::BitString,_true> local_190;
  undefined8 local_178;
  undefined1 local_170 [8];
  optional<bssl::der::Input> subject_unique_id;
  _Storage<bssl::der::BitString,_true> local_140;
  GeneralizedTime *local_128;
  undefined1 local_120 [8];
  optional<bssl::der::Input> issuer_unique_id;
  undefined1 auStack_f8 [8];
  Input validity_tlv;
  undefined1 local_c0 [8];
  optional<bssl::der::Input> version;
  undefined1 local_a0 [8];
  Parser tbs_parser;
  undefined1 local_68 [8];
  Parser parser;
  CertErrors unused_errors;
  CertErrors *errors_local;
  ParsedTbsCertificate *out_local;
  ParseCertificateOptions *options_local;
  Input tbs_tlv_local;
  
  version_00 = options;
  not_after = out;
  CertErrors::CertErrors((CertErrors *)&parser.advance_len_);
  unused_errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)out;
  if (out == (ParsedTbsCertificate *)0x0) {
    unused_errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&parser.advance_len_;
  }
  input.data_.size_ = (size_t)tbs_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser((Parser *)local_68,input);
  der::Parser::Parser((Parser *)local_a0);
  bVar1 = der::Parser::ReadSequence((Parser *)local_68,(Parser *)local_a0);
  if (bVar1) {
    ::std::optional<bssl::der::Input>::optional((optional<bssl::der::Input> *)local_c0);
    bVar1 = der::Parser::ReadOptionalTag
                      ((Parser *)local_a0,0xa0000000,(optional<bssl::der::Input> *)local_c0);
    if (bVar1) {
      bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_c0);
      if (bVar1) {
        pIVar2 = ::std::optional<bssl::der::Input>::value((optional<bssl::der::Input> *)local_c0);
        in.data_.size_ = (size_t)options;
        in.data_.data_ = (uchar *)(pIVar2->data_).size_;
        bVar1 = anon_unknown_0::ParseVersion
                          ((anon_unknown_0 *)(pIVar2->data_).data_,in,
                           (CertificateVersion *)version_00);
        if (!bVar1) {
          CertErrors::AddError
                    ((CertErrors *)
                     unused_errors.nodes_.
                     super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,"Failed parsing version");
          tbs_tlv_local.data_.size_._7_1_ = false;
          goto LAB_005ea38b;
        }
        if (*(int *)options == 0) {
          CertErrors::AddError
                    ((CertErrors *)
                     unused_errors.nodes_.
                     super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                     "Version explicitly V1 (should be omitted)");
          tbs_tlv_local.data_.size_._7_1_ = false;
          goto LAB_005ea38b;
        }
      }
      else {
        *(undefined4 *)options = 0;
      }
      bVar1 = der::Parser::ReadTag((Parser *)local_a0,2,(Input *)(options + 8));
      if (bVar1) {
        validity_tlv.data_.size_ = *(size_t *)(options + 8);
        value.data_.size_._0_4_ = *(byte *)tbs_tlv.data_.size_ & 1;
        value.data_.data_ = (uchar *)*(undefined8 *)(options + 0x10);
        value.data_.size_._4_4_ = 0;
        bVar1 = VerifySerialNumber((bssl *)validity_tlv.data_.size_,value,
                                   SUB81(unused_errors.nodes_.
                                         super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0),
                                   (CertErrors *)not_after);
        if ((bVar1) || ((*(byte *)tbs_tlv.data_.size_ & 1) != 0)) {
          bVar1 = anon_unknown_0::ReadSequenceTLV((Parser *)local_a0,(Input *)(options + 0x18));
          if (bVar1) {
            bVar1 = anon_unknown_0::ReadSequenceTLV((Parser *)local_a0,(Input *)(options + 0x28));
            if (bVar1) {
              der::Input::Input((Input *)auStack_f8);
              bVar1 = der::Parser::ReadRawTLV((Parser *)local_a0,(Input *)auStack_f8);
              if (bVar1) {
                issuer_unique_id.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                super__Optional_payload_base<bssl::der::Input>._16_8_ = auStack_f8;
                validity_tlv_00.data_.size_ = options + 0x38;
                not_before = (GeneralizedTime *)(options + 0x40);
                validity_tlv_00.data_.data_ = validity_tlv.data_.data_;
                bVar1 = ParseValidity((bssl *)auStack_f8,validity_tlv_00,not_before,
                                      (GeneralizedTime *)not_after);
                if (bVar1) {
                  bVar1 = anon_unknown_0::ReadSequenceTLV
                                    ((Parser *)local_a0,(Input *)(options + 0x48));
                  if (bVar1) {
                    bVar1 = anon_unknown_0::ReadSequenceTLV
                                      ((Parser *)local_a0,(Input *)(options + 0x58));
                    if (bVar1) {
                      ::std::optional<bssl::der::Input>::optional
                                ((optional<bssl::der::Input> *)local_120);
                      bVar1 = der::Parser::ReadOptionalTag
                                        ((Parser *)local_a0,0x80000001,
                                         (optional<bssl::der::Input> *)local_120);
                      if (bVar1) {
                        bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_120);
                        if (bVar1) {
                          pIVar2 = ::std::optional<bssl::der::Input>::value
                                             ((optional<bssl::der::Input> *)local_120);
                          subject_unique_id.super__Optional_base<bssl::der::Input,_true,_true>.
                          _M_payload.super__Optional_payload_base<bssl::der::Input>._16_8_ =
                               (pIVar2->data_).data_;
                          in_00.data_.size_ = (size_t)not_before;
                          in_00.data_.data_ = (uchar *)(pIVar2->data_).size_;
                          der::ParseBitString((optional<bssl::der::BitString> *)&local_140._M_value,
                                              (der *)subject_unique_id.
                                                                                                          
                                                  super__Optional_base<bssl::der::Input,_true,_true>
                                                  ._M_payload.
                                                  super__Optional_payload_base<bssl::der::Input>.
                                                  _16_8_,in_00);
                          *(uchar **)(options + 0x68) = local_140._M_value.bytes_.data_.data_;
                          *(size_t *)(options + 0x70) = local_140._M_value.bytes_.data_.size_;
                          *(undefined8 *)(options + 0x78) = local_140._16_8_;
                          *(GeneralizedTime **)(options + 0x80) = local_128;
                          bVar1 = ::std::optional::operator_cast_to_bool
                                            ((optional *)(options + 0x68));
                          if (!bVar1) {
                            CertErrors::AddError
                                      ((CertErrors *)
                                       unused_errors.nodes_.
                                       super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       "Failed parsing issuerUniqueId");
                            tbs_tlv_local.data_.size_._7_1_ = false;
                            goto LAB_005ea38b;
                          }
                          not_before = local_128;
                          if ((*(int *)options != 1) && (*(int *)options != 2)) {
                            CertErrors::AddError
                                      ((CertErrors *)
                                       unused_errors.nodes_.
                                       super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       "Unexpected issuerUniqueId (must be V2 or V3 certificate)");
                            tbs_tlv_local.data_.size_._7_1_ = false;
                            goto LAB_005ea38b;
                          }
                        }
                        ::std::optional<bssl::der::Input>::optional
                                  ((optional<bssl::der::Input> *)local_170);
                        bVar1 = der::Parser::ReadOptionalTag
                                          ((Parser *)local_a0,0x80000002,
                                           (optional<bssl::der::Input> *)local_170);
                        if (bVar1) {
                          bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_170);
                          if (bVar1) {
                            pIVar2 = ::std::optional<bssl::der::Input>::value
                                               ((optional<bssl::der::Input> *)local_170);
                            in_01.data_.size_ = (size_t)not_before;
                            in_01.data_.data_ = (uchar *)(pIVar2->data_).size_;
                            der::ParseBitString((optional<bssl::der::BitString> *)
                                                &local_190._M_value,(der *)(pIVar2->data_).data_,
                                                in_01);
                            *(uchar **)(options + 0x88) = local_190._M_value.bytes_.data_.data_;
                            *(size_t *)(options + 0x90) = local_190._M_value.bytes_.data_.size_;
                            *(undefined8 *)(options + 0x98) = local_190._16_8_;
                            *(undefined8 *)(options + 0xa0) = local_178;
                            bVar1 = ::std::optional::operator_cast_to_bool
                                              ((optional *)(options + 0x88));
                            if (!bVar1) {
                              CertErrors::AddError
                                        ((CertErrors *)
                                         unused_errors.nodes_.
                                         super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         "Failed parsing subjectUniqueId");
                              tbs_tlv_local.data_.size_._7_1_ = false;
                              goto LAB_005ea38b;
                            }
                            if ((*(int *)options != 1) && (*(int *)options != 2)) {
                              CertErrors::AddError
                                        ((CertErrors *)
                                         unused_errors.nodes_.
                                         super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         "Unexpected subjectUniqueId (must be V2 or V3 certificate)"
                                        );
                              tbs_tlv_local.data_.size_._7_1_ = false;
                              goto LAB_005ea38b;
                            }
                          }
                          bVar1 = der::Parser::ReadOptionalTag
                                            ((Parser *)local_a0,0xa0000003,
                                             (optional<bssl::der::Input> *)(options + 0xa8));
                          if (bVar1) {
                            bVar1 = ::std::optional::operator_cast_to_bool
                                              ((optional *)(options + 0xa8));
                            if (bVar1) {
                              pIVar2 = ::std::optional<bssl::der::Input>::value
                                                 ((optional<bssl::der::Input> *)(options + 0xa8));
                              input_00.data_.size_ = extraout_RDX;
                              input_00.data_.data_ = (uchar *)(pIVar2->data_).size_;
                              bVar1 = anon_unknown_0::IsSequenceTLV
                                                ((anon_unknown_0 *)(pIVar2->data_).data_,input_00);
                              if (!bVar1) {
                                CertErrors::AddError
                                          ((CertErrors *)
                                           unused_errors.nodes_.
                                           super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           "Failed reading extensions SEQUENCE");
                                tbs_tlv_local.data_.size_._7_1_ = false;
                                goto LAB_005ea38b;
                              }
                              if (*(int *)options != 2) {
                                CertErrors::AddError
                                          ((CertErrors *)
                                           unused_errors.nodes_.
                                           super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           "Unexpected extensions (must be V3 certificate)");
                                tbs_tlv_local.data_.size_._7_1_ = false;
                                goto LAB_005ea38b;
                              }
                            }
                            bVar1 = der::Parser::HasMore((Parser *)local_a0);
                            if (bVar1) {
                              CertErrors::AddError
                                        ((CertErrors *)
                                         unused_errors.nodes_.
                                         super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         "Unconsumed data inside TBSCertificate");
                              tbs_tlv_local.data_.size_._7_1_ = false;
                            }
                            else {
                              bVar1 = der::Parser::HasMore((Parser *)local_68);
                              if (bVar1) {
                                tbs_tlv_local.data_.size_._7_1_ = false;
                              }
                              else {
                                tbs_tlv_local.data_.size_._7_1_ = true;
                              }
                            }
                          }
                          else {
                            CertErrors::AddError
                                      ((CertErrors *)
                                       unused_errors.nodes_.
                                       super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       "Failed reading extensions SEQUENCE");
                            tbs_tlv_local.data_.size_._7_1_ = false;
                          }
                        }
                        else {
                          CertErrors::AddError
                                    ((CertErrors *)
                                     unused_errors.nodes_.
                                     super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     "Failed reading subjectUniqueId");
                          tbs_tlv_local.data_.size_._7_1_ = false;
                        }
                      }
                      else {
                        CertErrors::AddError
                                  ((CertErrors *)
                                   unused_errors.nodes_.
                                   super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   "Failed reading issuerUniqueId");
                        tbs_tlv_local.data_.size_._7_1_ = false;
                      }
                    }
                    else {
                      CertErrors::AddError
                                ((CertErrors *)
                                 unused_errors.nodes_.
                                 super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 "Failed reading subjectPublicKeyInfo");
                      tbs_tlv_local.data_.size_._7_1_ = false;
                    }
                  }
                  else {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed reading subject");
                    tbs_tlv_local.data_.size_._7_1_ = false;
                  }
                }
                else {
                  CertErrors::AddError
                            ((CertErrors *)
                             unused_errors.nodes_.
                             super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                             "Failed parsing validity");
                  tbs_tlv_local.data_.size_._7_1_ = false;
                }
              }
              else {
                CertErrors::AddError
                          ((CertErrors *)
                           unused_errors.nodes_.
                           super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                           "Failed reading validity");
                tbs_tlv_local.data_.size_._7_1_ = false;
              }
            }
            else {
              CertErrors::AddError
                        ((CertErrors *)
                         unused_errors.nodes_.
                         super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,"Failed reading issuer");
              tbs_tlv_local.data_.size_._7_1_ = false;
            }
          }
          else {
            CertErrors::AddError
                      ((CertErrors *)
                       unused_errors.nodes_.
                       super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage,"Failed reading signature");
            tbs_tlv_local.data_.size_._7_1_ = false;
          }
        }
        else {
          tbs_tlv_local.data_.size_._7_1_ = false;
        }
      }
      else {
        CertErrors::AddError
                  ((CertErrors *)
                   unused_errors.nodes_.
                   super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,"Failed reading serialNumber");
        tbs_tlv_local.data_.size_._7_1_ = false;
      }
    }
    else {
      CertErrors::AddError
                ((CertErrors *)
                 unused_errors.nodes_.
                 super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,"Failed reading version");
      tbs_tlv_local.data_.size_._7_1_ = false;
    }
  }
  else {
    CertErrors::AddError
              ((CertErrors *)
               unused_errors.nodes_.
               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,"Failed parsing TBSCertificate SEQUENCE");
    tbs_tlv_local.data_.size_._7_1_ = false;
  }
LAB_005ea38b:
  version.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
  super__Optional_payload_base<bssl::der::Input>._20_4_ = 1;
  CertErrors::~CertErrors((CertErrors *)&parser.advance_len_);
  return tbs_tlv_local.data_.size_._7_1_;
}

Assistant:

bool ParseTbsCertificate(der::Input tbs_tlv,
                         const ParseCertificateOptions &options,
                         ParsedTbsCertificate *out, CertErrors *errors) {
  // The rest of this function assumes that |errors| is non-null.
  CertErrors unused_errors;
  if (!errors) {
    errors = &unused_errors;
  }

  // TODO(crbug.com/634443): Add useful error information to |errors|.

  der::Parser parser(tbs_tlv);

  //   TBSCertificate  ::=  SEQUENCE  {
  der::Parser tbs_parser;
  if (!parser.ReadSequence(&tbs_parser)) {
    errors->AddError(kTbsNotSequence);
    return false;
  }

  //        version         [0]  EXPLICIT Version DEFAULT v1,
  std::optional<der::Input> version;
  if (!tbs_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0, &version)) {
    errors->AddError(kFailedReadingVersion);
    return false;
  }
  if (version) {
    if (!ParseVersion(version.value(), &out->version)) {
      errors->AddError(kFailedParsingVersion);
      return false;
    }
    if (out->version == CertificateVersion::V1) {
      errors->AddError(kVersionExplicitlyV1);
      // The correct way to specify v1 is to omit the version field since v1 is
      // the DEFAULT.
      return false;
    }
  } else {
    out->version = CertificateVersion::V1;
  }

  //        serialNumber         CertificateSerialNumber,
  if (!tbs_parser.ReadTag(CBS_ASN1_INTEGER, &out->serial_number)) {
    errors->AddError(kFailedReadingSerialNumber);
    return false;
  }
  if (!VerifySerialNumber(out->serial_number,
                          options.allow_invalid_serial_numbers, errors)) {
    // Invalid serial numbers are only considered fatal failures if
    // |!allow_invalid_serial_numbers|.
    if (!options.allow_invalid_serial_numbers) {
      return false;
    }
  }

  //        signature            AlgorithmIdentifier,
  if (!ReadSequenceTLV(&tbs_parser, &out->signature_algorithm_tlv)) {
    errors->AddError(kFailedReadingSignatureValue);
    return false;
  }

  //        issuer               Name,
  if (!ReadSequenceTLV(&tbs_parser, &out->issuer_tlv)) {
    errors->AddError(kFailedReadingIssuer);
    return false;
  }

  //        validity             Validity,
  der::Input validity_tlv;
  if (!tbs_parser.ReadRawTLV(&validity_tlv)) {
    errors->AddError(kFailedReadingValidity);
    return false;
  }
  if (!ParseValidity(validity_tlv, &out->validity_not_before,
                     &out->validity_not_after)) {
    errors->AddError(kFailedParsingValidity);
    return false;
  }

  //        subject              Name,
  if (!ReadSequenceTLV(&tbs_parser, &out->subject_tlv)) {
    errors->AddError(kFailedReadingSubject);
    return false;
  }

  //        subjectPublicKeyInfo SubjectPublicKeyInfo,
  if (!ReadSequenceTLV(&tbs_parser, &out->spki_tlv)) {
    errors->AddError(kFailedReadingSpki);
    return false;
  }

  //        issuerUniqueID  [1]  IMPLICIT UniqueIdentifier OPTIONAL,
  //                             -- If present, version MUST be v2 or v3
  std::optional<der::Input> issuer_unique_id;
  if (!tbs_parser.ReadOptionalTag(CBS_ASN1_CONTEXT_SPECIFIC | 1,
                                  &issuer_unique_id)) {
    errors->AddError(kFailedReadingIssuerUniqueId);
    return false;
  }
  if (issuer_unique_id) {
    out->issuer_unique_id = der::ParseBitString(issuer_unique_id.value());
    if (!out->issuer_unique_id) {
      errors->AddError(kFailedParsingIssuerUniqueId);
      return false;
    }
    if (out->version != CertificateVersion::V2 &&
        out->version != CertificateVersion::V3) {
      errors->AddError(kIssuerUniqueIdNotExpected);
      return false;
    }
  }

  //        subjectUniqueID [2]  IMPLICIT UniqueIdentifier OPTIONAL,
  //                             -- If present, version MUST be v2 or v3
  std::optional<der::Input> subject_unique_id;
  if (!tbs_parser.ReadOptionalTag(CBS_ASN1_CONTEXT_SPECIFIC | 2,
                                  &subject_unique_id)) {
    errors->AddError(kFailedReadingSubjectUniqueId);
    return false;
  }
  if (subject_unique_id) {
    out->subject_unique_id = der::ParseBitString(subject_unique_id.value());
    if (!out->subject_unique_id) {
      errors->AddError(kFailedParsingSubjectUniqueId);
      return false;
    }
    if (out->version != CertificateVersion::V2 &&
        out->version != CertificateVersion::V3) {
      errors->AddError(kSubjectUniqueIdNotExpected);
      return false;
    }
  }

  //        extensions      [3]  EXPLICIT Extensions OPTIONAL
  //                             -- If present, version MUST be v3
  if (!tbs_parser.ReadOptionalTag(
          CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 3,
          &out->extensions_tlv)) {
    errors->AddError(kFailedReadingExtensions);
    return false;
  }
  if (out->extensions_tlv) {
    // extensions_tlv must be a single element. Also check that it is a
    // SEQUENCE.
    if (!IsSequenceTLV(out->extensions_tlv.value())) {
      errors->AddError(kFailedReadingExtensions);
      return false;
    }
    if (out->version != CertificateVersion::V3) {
      errors->AddError(kUnexpectedExtensions);
      return false;
    }
  }

  // Note that there IS an extension point at the end of TBSCertificate
  // (according to RFC 5912), so from that interpretation, unconsumed data would
  // be allowed in |tbs_parser|.
  //
  // However because only v1, v2, and v3 certificates are supported by the
  // parsing, there shouldn't be any subsequent data in those versions, so
  // reject.
  if (tbs_parser.HasMore()) {
    errors->AddError(kUnconsumedDataInsideTbsCertificateSequence);
    return false;
  }

  // By definition the input was a single TBSCertificate, so there shouldn't be
  // unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  return true;
}